

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O0

void I_InitGraphics(void)

{
  UCVarValue value;
  IVideo *pIVar1;
  int iVar2;
  undefined8 uVar3;
  SDLVideo *this;
  undefined7 uStack_f;
  UCVarValue val;
  
  iVar2 = SDL_InitSubSystem(0x20);
  if (iVar2 < 0) {
    uVar3 = SDL_GetError();
    I_FatalError("Could not initialize SDL video:\n%s\n",uVar3);
  }
  else {
    uVar3 = SDL_GetCurrentVideoDriver();
    Printf("Using video driver %s\n",uVar3);
    iVar2 = DArgs::CheckParm(Args,"-devparm",1);
    value._1_7_ = uStack_f;
    value.Bool = iVar2 != 0;
    FBoolCVar::SetGenericRepDefault(&ticker,value,CVAR_Bool);
    this = (SDLVideo *)operator_new(0x10);
    SDLVideo::SDLVideo(this,0);
    Video = (IVideo *)this;
    if (this == (SDLVideo *)0x0) {
      I_FatalError("Failed to initialize display");
    }
    addterm(I_ShutdownGraphics,"I_ShutdownGraphics");
    pIVar1 = Video;
    FFloatCVar::operator_cast_to_float(&vid_winscale);
    (*pIVar1->_vptr_IVideo[3])();
  }
  return;
}

Assistant:

void I_InitGraphics ()
{
	if (SDL_InitSubSystem (SDL_INIT_VIDEO) < 0)
	{
		I_FatalError ("Could not initialize SDL video:\n%s\n", SDL_GetError());
		return;
	}

	Printf("Using video driver %s\n", SDL_GetCurrentVideoDriver());

	UCVarValue val;

	val.Bool = !!Args->CheckParm ("-devparm");
	ticker.SetGenericRepDefault (val, CVAR_Bool);

	Video = new SDLVideo (0);
	if (Video == NULL)
		I_FatalError ("Failed to initialize display");

	atterm (I_ShutdownGraphics);

	Video->SetWindowedScale (vid_winscale);
}